

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

void jsonip::detail::stl_pushbackable_helper<std::vector<P,std::allocator<P>>>::
     write<jsonip::writer<false>>(writer<false> *w,vector<P,_std::allocator<P>_> *t)

{
  pointer t_00;
  
  writer<false>::array_start(w);
  for (t_00 = (t->super__Vector_base<P,_std::allocator<P>_>)._M_impl.super__Vector_impl_data.
              _M_start;
      t_00 != (t->super__Vector_base<P,_std::allocator<P>_>)._M_impl.super__Vector_impl_data.
              _M_finish; t_00 = t_00 + 1) {
    struct_helper<P>::write<jsonip::writer<false>>(w,t_00);
  }
  writer<false>::array_end(w);
  return;
}

Assistant:

static void write(Writer& w, const T& t)
        {
            w.array_start();
            for (typename T::const_iterator it = t.begin(); it != t.end(); ++it)
            {
                slice_helper::type::write(w, *it);
            }
            w.array_end();
        }